

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O0

void on_start(void)

{
  if ((quest_status._0_4_ & 1) == 0) {
    qt_pager(1);
    quest_status._0_4_ = quest_status._0_4_ & 0xfffffffe | 1;
  }
  else if ((u.uz0.dnum != u.uz.dnum) || (u.uz0.dlevel < u.uz.dlevel)) {
    if (((uint)quest_status._0_4_ >> 2 & 7) < 3) {
      qt_pager(2);
    }
    else {
      qt_pager(3);
    }
  }
  return;
}

Assistant:

static void on_start(void)
{
  if (!Qstat(first_start)) {
    qt_pager(QT_FIRSTTIME);
    Qstat(first_start) = TRUE;
  } else if ((u.uz0.dnum != u.uz.dnum) || (u.uz0.dlevel < u.uz.dlevel)) {
    if (Qstat(not_ready) <= 2) qt_pager(QT_NEXTTIME);
    else	qt_pager(QT_OTHERTIME);
  }
}